

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O1

event_process_result
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
::process_event<afsm::test::events::terminate>
          (states_tuple *states,size_t current_state,terminate *event)

{
  event_process_result eVar1;
  invocation_table<afsm::test::events::terminate> *piVar2;
  logic_error *this;
  long lVar3;
  undefined1 *puVar4;
  invocation_table<afsm::test::events::terminate> inv_table;
  indexes_tuple<0UL,_1UL,_2UL,_3UL,_4UL,_5UL> local_e9;
  _Any_data _Stack_e8;
  long alStack_d8 [18];
  undefined1 local_48 [16];
  undefined8 local_38 [2];
  
  if (5 < current_state) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid current state index");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  piVar2 = inner_dispatch_table<std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::connecting,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::authorizing,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::terminated,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>
           ::state_table<afsm::test::events::terminate,0ul,1ul,2ul,3ul,4ul,5ul>(&local_e9);
  lVar3 = 0;
  do {
    std::
    function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::terminate_&&)>
    ::function((function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::terminate_&&)>
                *)((long)&_Stack_e8 + lVar3),
               (function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::closed,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::connecting,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::authorizing,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::connection_fsm_def::terminated,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::terminate_&&)>
                *)((long)&piVar2->_M_elems[0].super__Function_base._M_functor + lVar3));
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xc0);
  if (*(long *)((long)alStack_d8 + current_state * 0x20) != 0) {
    eVar1 = (**(code **)((long)alStack_d8 + current_state * 0x20 + 8))
                      (&_Stack_e8 + current_state * 2,states,event);
    lVar3 = -0xc0;
    puVar4 = local_48;
    do {
      if (*(code **)(puVar4 + 0x10) != (code *)0x0) {
        (**(code **)(puVar4 + 0x10))(puVar4,puVar4,3);
      }
      puVar4 = puVar4 + -0x20;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return eVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

static event_process_result
    process_event(states_tuple& states, ::std::size_t current_state, Event&& event)
    {
        //using event_type = typename ::std::decay<Event>::type;
        if (current_state >= size)
            throw ::std::logic_error{ "Invalid current state index" };
        auto inv_table = state_table< Event >(indexes_tuple{});
        return inv_table[current_state](states, ::std::forward<Event>(event));
    }